

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_manager.cpp
# Opt level: O1

Type * __thiscall
spvtools::opt::analysis::TypeManager::RecordIfTypeDefinition(TypeManager *this,Instruction *inst)

{
  pointer *ppvVar1;
  IdToTypeMap *this_00;
  Op OVar2;
  mapped_type pIVar3;
  IRContext *pIVar4;
  mapped_type pTVar5;
  pointer pOVar6;
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  _Var7;
  pointer ppIVar8;
  int32_t iVar9;
  uint32_t uVar10;
  uint32_t use;
  uint32_t uVar11;
  StorageClass sc;
  ImageFormat f;
  uint32_t uVar12;
  NodePayloadArrayAMDX *this_01;
  TensorViewNV *this_02;
  Function *this_03;
  Struct *this_04;
  Vector *this_05;
  Operand *this_06;
  mapped_type *ppIVar13;
  CooperativeVectorNV *this_07;
  Type *pTVar14;
  TensorLayoutNV *this_08;
  CooperativeMatrixKHR *this_09;
  CooperativeMatrixNV *this_10;
  Matrix *this_11;
  Pointer *this_12;
  Image *this_13;
  size_type sVar15;
  Type *pTVar16;
  mapped_type *ppTVar17;
  mapped_type *pmVar18;
  Array *this_14;
  undefined **ppuVar19;
  undefined *puVar20;
  uint *puVar21;
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  _Var22;
  uint uVar23;
  TypeManager *this_15;
  MessageConsumer *consumer;
  char *message;
  Type *unaff_R12;
  uint uVar24;
  uint uVar25;
  pointer ppIVar26;
  bool bVar27;
  pair<std::__detail::_Node_iterator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true,_true>,_bool>
  pVar28;
  AccessQualifier qualifier;
  Type *type;
  bool has_spec_id;
  uint32_t id;
  vector<unsigned_int,_std::allocator<unsigned_int>_> extra_words;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> decorations;
  pointer local_b0;
  unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
  unique;
  uint32_t local_8c;
  uint32_t local_88;
  Dim local_84;
  Type *local_80;
  string local_78;
  _Any_data local_58;
  __buckets_ptr local_48;
  code *pcStack_40;
  
  OVar2 = inst->opcode_;
  iVar9 = spvOpcodeGeneratesType(OVar2);
  if ((OVar2 != OpTypeForwardPointer) && (iVar9 == 0)) {
    return (Type *)0x0;
  }
  type = (Type *)0x0;
  OVar2 = inst->opcode_;
  if (0x141 < (int)OVar2) {
    if ((int)OVar2 < 0x14a1) {
      if ((int)OVar2 < 0x1168) {
        if (OVar2 == OpTypePipeStorage) {
          type = (Type *)operator_new(0x28);
          (type->decorations_).
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (type->decorations_).
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (type->decorations_).
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          type->kind_ = kPipeStorage;
          ppuVar19 = &PTR__Type_0094a848;
        }
        else {
          if (OVar2 != OpTypeNamedBarrier) goto switchD_00549b55_default;
          type = (Type *)operator_new(0x28);
          (type->decorations_).
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (type->decorations_).
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (type->decorations_).
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          type->kind_ = kNamedBarrier;
          ppuVar19 = &PTR__Type_0094aaa8;
        }
      }
      else {
        if (OVar2 == OpTypeCooperativeMatrixKHR) {
          this_09 = (CooperativeMatrixKHR *)operator_new(0x40);
          uVar12 = (inst->has_result_id_ & 1) + 1;
          if (inst->has_type_id_ == false) {
            uVar12 = (uint)inst->has_result_id_;
          }
          uVar12 = Instruction::GetSingleWordOperand(inst,uVar12);
          pTVar14 = GetType(this,uVar12);
          uVar24 = (inst->has_result_id_ & 1) + 1;
          if (inst->has_type_id_ == false) {
            uVar24 = (uint)inst->has_result_id_;
          }
          uVar12 = Instruction::GetSingleWordOperand(inst,uVar24 + 1);
          uVar24 = (inst->has_result_id_ & 1) + 1;
          if (inst->has_type_id_ == false) {
            uVar24 = (uint)inst->has_result_id_;
          }
          uVar10 = Instruction::GetSingleWordOperand(inst,uVar24 + 2);
          uVar24 = (inst->has_result_id_ & 1) + 1;
          if (inst->has_type_id_ == false) {
            uVar24 = (uint)inst->has_result_id_;
          }
          uVar11 = Instruction::GetSingleWordOperand(inst,uVar24 + 3);
          uVar24 = (inst->has_result_id_ & 1) + 1;
          if (inst->has_type_id_ == false) {
            uVar24 = (uint)inst->has_result_id_;
          }
          use = Instruction::GetSingleWordOperand(inst,uVar24 | 4);
          CooperativeMatrixKHR::CooperativeMatrixKHR(this_09,pTVar14,uVar12,uVar10,uVar11,use);
          type = (Type *)this_09;
          goto LAB_0054ad3b;
        }
        if (OVar2 != OpTypeRayQueryKHR) {
          if (OVar2 != OpTypeNodePayloadArrayAMDX) goto switchD_00549b55_default;
          this_01 = (NodePayloadArrayAMDX *)operator_new(0x30);
          uVar12 = (inst->has_result_id_ & 1) + 1;
          if (inst->has_type_id_ == false) {
            uVar12 = (uint)inst->has_result_id_;
          }
          uVar12 = Instruction::GetSingleWordOperand(inst,uVar12);
          pTVar14 = GetType(this,uVar12);
          NodePayloadArrayAMDX::NodePayloadArrayAMDX(this_01,pTVar14);
          goto LAB_0054aba7;
        }
        type = (Type *)operator_new(0x28);
        (type->decorations_).
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (type->decorations_).
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (type->decorations_).
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        type->kind_ = kRayQueryKHR;
        ppuVar19 = &PTR__Type_0094af68;
      }
    }
    else {
      if (0x14ed < (int)OVar2) {
        if (OVar2 == OpTypeCooperativeMatrixNV) {
          this_10 = (CooperativeMatrixNV *)operator_new(0x40);
          uVar12 = (inst->has_result_id_ & 1) + 1;
          if (inst->has_type_id_ == false) {
            uVar12 = (uint)inst->has_result_id_;
          }
          uVar12 = Instruction::GetSingleWordOperand(inst,uVar12);
          pTVar14 = GetType(this,uVar12);
          uVar24 = (inst->has_result_id_ & 1) + 1;
          if (inst->has_type_id_ == false) {
            uVar24 = (uint)inst->has_result_id_;
          }
          uVar12 = Instruction::GetSingleWordOperand(inst,uVar24 + 1);
          uVar24 = (inst->has_result_id_ & 1) + 1;
          if (inst->has_type_id_ == false) {
            uVar24 = (uint)inst->has_result_id_;
          }
          uVar10 = Instruction::GetSingleWordOperand(inst,uVar24 + 2);
          uVar24 = (inst->has_result_id_ & 1) + 1;
          if (inst->has_type_id_ == false) {
            uVar24 = (uint)inst->has_result_id_;
          }
          uVar11 = Instruction::GetSingleWordOperand(inst,uVar24 + 3);
          CooperativeMatrixNV::CooperativeMatrixNV(this_10,pTVar14,uVar12,uVar10,uVar11);
          type = (Type *)this_10;
        }
        else if (OVar2 == OpTypeTensorLayoutNV) {
          this_08 = (TensorLayoutNV *)operator_new(0x30);
          uVar12 = (inst->has_result_id_ & 1) + 1;
          if (inst->has_type_id_ == false) {
            uVar12 = (uint)inst->has_result_id_;
          }
          uVar12 = Instruction::GetSingleWordOperand(inst,uVar12);
          uVar24 = (inst->has_result_id_ & 1) + 1;
          if (inst->has_type_id_ == false) {
            uVar24 = (uint)inst->has_result_id_;
          }
          uVar10 = Instruction::GetSingleWordOperand(inst,uVar24 + 1);
          TensorLayoutNV::TensorLayoutNV(this_08,uVar12,uVar10);
          type = (Type *)this_08;
        }
        else {
          if (OVar2 != OpTypeTensorViewNV) goto switchD_00549b55_default;
          uVar24 = (int)((ulong)((long)(inst->operands_).
                                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(inst->operands_).
                                      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555
          ;
          decorations.
          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          decorations.
          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          decorations.
          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if (2 < uVar24) {
            uVar12 = 2;
            do {
              uVar10 = Instruction::GetSingleWordOperand(inst,uVar12);
              extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(extra_words.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,uVar10);
              if (decorations.
                  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish ==
                  decorations.
                  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                _M_realloc_insert<unsigned_int>
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&decorations,
                           (iterator)
                           decorations.
                           super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish,(uint *)&extra_words);
              }
              else {
                *(uint32_t *)
                 decorations.
                 super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish = uVar10;
                decorations.
                super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     (pointer)((long)decorations.
                                     super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish + 4);
              }
              uVar12 = uVar12 + 1;
            } while (uVar24 != uVar12);
          }
          this_02 = (TensorViewNV *)operator_new(0x48);
          uVar12 = (inst->has_result_id_ & 1) + 1;
          if (inst->has_type_id_ == false) {
            uVar12 = (uint)inst->has_result_id_;
          }
          uVar12 = Instruction::GetSingleWordOperand(inst,uVar12);
          uVar24 = (inst->has_result_id_ & 1) + 1;
          if (inst->has_type_id_ == false) {
            uVar24 = (uint)inst->has_result_id_;
          }
          uVar10 = Instruction::GetSingleWordOperand(inst,uVar24 + 1);
          TensorViewNV::TensorViewNV
                    (this_02,uVar12,uVar10,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&decorations);
          type = (Type *)this_02;
          if (decorations.
              super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(decorations.
                            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)decorations.
                                  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)decorations.
                                  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
        }
        goto LAB_0054ad3b;
      }
      if (OVar2 == OpTypeHitObjectNV) {
        type = (Type *)operator_new(0x28);
        (type->decorations_).
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (type->decorations_).
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (type->decorations_).
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        type->kind_ = kHitObjectNV;
        ppuVar19 = &PTR__Type_0094b1c8;
      }
      else {
        if (OVar2 == OpTypeCooperativeVectorNV) {
          this_07 = (CooperativeVectorNV *)operator_new(0x38);
          uVar12 = (inst->has_result_id_ & 1) + 1;
          if (inst->has_type_id_ == false) {
            uVar12 = (uint)inst->has_result_id_;
          }
          uVar12 = Instruction::GetSingleWordOperand(inst,uVar12);
          pTVar14 = GetType(this,uVar12);
          uVar24 = (inst->has_result_id_ & 1) + 1;
          if (inst->has_type_id_ == false) {
            uVar24 = (uint)inst->has_result_id_;
          }
          uVar12 = Instruction::GetSingleWordOperand(inst,uVar24 + 1);
          CooperativeVectorNV::CooperativeVectorNV(this_07,pTVar14,uVar12);
          type = (Type *)this_07;
          goto LAB_0054ad3b;
        }
        if (OVar2 != OpTypeAccelerationStructureKHR) goto switchD_00549b55_default;
        type = (Type *)operator_new(0x28);
        (type->decorations_).
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (type->decorations_).
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (type->decorations_).
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        type->kind_ = kAccelerationStructureNV;
        ppuVar19 = &PTR__Type_0094ad08;
      }
    }
    goto LAB_0054ab5d;
  }
  switch(OVar2) {
  case OpTypeVoid:
    type = (Type *)operator_new(0x28);
    (type->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (type->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined8 *)
     ((long)&(type->decorations_).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
    *(undefined8 *)
     ((long)&(type->decorations_).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
    ppuVar19 = &PTR__Type_009497a8;
    goto LAB_0054ab5d;
  case OpTypeBool:
    type = (Type *)operator_new(0x28);
    (type->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (type->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (type->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    type->kind_ = kBool;
    ppuVar19 = &PTR__Type_00949a08;
    goto LAB_0054ab5d;
  case OpTypeInt:
    pTVar14 = (Type *)operator_new(0x30);
    uVar12 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar12 = (uint)inst->has_result_id_;
    }
    uVar12 = Instruction::GetSingleWordOperand(inst,uVar12);
    uVar24 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar24 = (uint)inst->has_result_id_;
    }
    uVar10 = Instruction::GetSingleWordOperand(inst,uVar24 + 1);
    (pTVar14->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pTVar14->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pTVar14->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pTVar14->kind_ = kInteger;
    pTVar14->_vptr_Type = (_func_int **)&PTR__Type_0094d428;
    *(uint32_t *)&pTVar14->field_0x24 = uVar12;
    *(bool *)&pTVar14[1]._vptr_Type = uVar10 != 0;
    type = pTVar14;
    break;
  case OpTypeFloat:
    pTVar14 = (Type *)operator_new(0x28);
    uVar12 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar12 = (uint)inst->has_result_id_;
    }
    uVar12 = Instruction::GetSingleWordOperand(inst,uVar12);
    (pTVar14->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pTVar14->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pTVar14->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pTVar14->kind_ = kFloat;
    puVar20 = &Float::vtable;
    goto LAB_0054acfc;
  case OpTypeVector:
    this_05 = (Vector *)operator_new(0x38);
    uVar12 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar12 = (uint)inst->has_result_id_;
    }
    uVar12 = Instruction::GetSingleWordOperand(inst,uVar12);
    pTVar14 = GetType(this,uVar12);
    uVar24 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar24 = (uint)inst->has_result_id_;
    }
    uVar12 = Instruction::GetSingleWordOperand(inst,uVar24 + 1);
    Vector::Vector(this_05,pTVar14,uVar12);
    type = (Type *)this_05;
    break;
  case OpTypeMatrix:
    this_11 = (Matrix *)operator_new(0x38);
    uVar12 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar12 = (uint)inst->has_result_id_;
    }
    uVar12 = Instruction::GetSingleWordOperand(inst,uVar12);
    pTVar14 = GetType(this,uVar12);
    uVar24 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar24 = (uint)inst->has_result_id_;
    }
    uVar12 = Instruction::GetSingleWordOperand(inst,uVar24 + 1);
    Matrix::Matrix(this_11,pTVar14,uVar12);
    type = (Type *)this_11;
    break;
  case OpTypeImage:
    uVar24 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar24 = (uint)inst->has_result_id_;
    }
    f = ImageFormatUnknown;
    if (7 < (int)((ulong)((long)(inst->operands_).
                                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(inst->operands_).
                               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 -
            uVar24) {
      f = Instruction::GetSingleWordOperand(inst,uVar24 + 7);
    }
    this_13 = (Image *)operator_new(0x48);
    uVar12 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar12 = (uint)inst->has_result_id_;
    }
    uVar12 = Instruction::GetSingleWordOperand(inst,uVar12);
    local_80 = GetType(this,uVar12);
    uVar24 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar24 = (uint)inst->has_result_id_;
    }
    local_84 = Instruction::GetSingleWordOperand(inst,uVar24 + 1);
    uVar24 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar24 = (uint)inst->has_result_id_;
    }
    local_88 = Instruction::GetSingleWordOperand(inst,uVar24 + 2);
    uVar24 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar24 = (uint)inst->has_result_id_;
    }
    uVar12 = Instruction::GetSingleWordOperand(inst,uVar24 + 3);
    uVar24 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar24 = (uint)inst->has_result_id_;
    }
    uVar10 = Instruction::GetSingleWordOperand(inst,uVar24 | 4);
    uVar24 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar24 = (uint)inst->has_result_id_;
    }
    Instruction::GetSingleWordOperand(inst,uVar24 + 5);
    uVar24 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar24 = (uint)inst->has_result_id_;
    }
    qualifier = 0x54ab05;
    uVar11 = Instruction::GetSingleWordOperand(inst,uVar24 + 6);
    Image::Image(this_13,local_80,local_84,local_88,uVar12 == 1,uVar10 == 1,uVar11,f,qualifier);
    type = (Type *)this_13;
    break;
  case OpTypeSampler:
    type = (Type *)operator_new(0x28);
    (type->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (type->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (type->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    type->kind_ = kSampler;
    ppuVar19 = &PTR__Type_00949c68;
    goto LAB_0054ab5d;
  case OpTypeSampledImage:
    pTVar14 = (Type *)operator_new(0x30);
    uVar12 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar12 = (uint)inst->has_result_id_;
    }
    uVar12 = Instruction::GetSingleWordOperand(inst,uVar12);
    pTVar16 = GetType(this,uVar12);
    (pTVar14->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pTVar14->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pTVar14->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pTVar14->kind_ = kSampledImage;
    pTVar14->_vptr_Type = (_func_int **)&PTR__Type_0094d8e8;
    pTVar14[1]._vptr_Type = (_func_int **)pTVar16;
    type = pTVar14;
    break;
  case OpTypeArray:
    uVar24 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar24 = (uint)inst->has_result_id_;
    }
    uVar12 = Instruction::GetSingleWordOperand(inst,uVar24 + 1);
    unique._M_t.
    super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
    .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl._0_4_ = uVar12;
    ppIVar13 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_const_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_const_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_const_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_const_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->id_to_constant_inst_,(key_type *)&unique);
    pIVar3 = *ppIVar13;
    if (pIVar3 == (mapped_type)0x0) {
      __assert_fail("length_constant_inst",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/type_manager.cpp"
                    ,0x33a,
                    "Type *spvtools::opt::analysis::TypeManager::RecordIfTypeDefinition(const Instruction &)"
                   );
    }
    extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)operator_new(4);
    extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start + 1;
    *extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_start = 2;
    id = 0;
    has_spec_id = false;
    extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (pIVar3->opcode_ == OpSpecConstant) {
      pIVar4 = this->context_;
      if ((pIVar4->valid_analyses_ & kAnalysisDecorations) == kAnalysisNone) {
        IRContext::BuildDecorationManager(pIVar4);
      }
      local_58._M_unused._M_object = &id;
      local_58._8_8_ = &has_spec_id;
      pcStack_40 = std::
                   _Function_handler<void_(const_spvtools::opt::Instruction_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/type_manager.cpp:839:13)>
                   ::_M_invoke;
      local_48 = (__buckets_ptr)
                 std::
                 _Function_handler<void_(const_spvtools::opt::Instruction_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/type_manager.cpp:839:13)>
                 ::_M_manager;
      DecorationManager::ForEachDecoration
                ((pIVar4->decoration_mgr_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
                 .super__Head_base<0UL,_spvtools::opt::analysis::DecorationManager_*,_false>.
                 _M_head_impl,
                 (uint32_t)
                 unique._M_t.
                 super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
                 .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl,1,
                 (function<void_(const_spvtools::opt::Instruction_&)> *)&local_58);
      if (local_48 != (__buckets_ptr)0x0) {
        (*(code *)local_48)(&local_58,&local_58,3);
      }
    }
    OVar2 = pIVar3->opcode_;
    if (has_spec_id == true) {
      if (extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&extra_words,
                   (iterator)
                   extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&id);
      }
      else {
        *extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish = id;
        extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
    }
    if ((OVar2 == OpSpecConstant) || (OVar2 == OpConstant)) {
      pOVar6 = (pIVar3->operands_).
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(pIVar3->operands_).
                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar6 >> 4) *
                 -0x5555555555555555) < 3) {
        __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                      ,0x2a5,"const Operand &spvtools::opt::Instruction::GetOperand(uint32_t) const"
                     );
      }
      _Var7._M_t.
      super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
      _M_head_impl = pOVar6[2].words.large_data_._M_t.
                     super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_t;
      _Var22._M_t.
      super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
      _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )(tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        )&pOVar6[2].words.small_data_;
      if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )_Var7._M_t.
            super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            .
            super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
            ._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        _Var22._M_t.
        super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
        _M_head_impl = _Var7._M_t.
                       super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       .
                       super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                       ._M_head_impl;
      }
      if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )_Var7._M_t.
            super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            .
            super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
            ._M_head_impl == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        puVar21 = pOVar6[2].words.small_data_ + pOVar6[2].words.size_;
      }
      else {
        puVar21 = *(uint **)((long)_Var7._M_t.
                                   super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                                   ._M_head_impl + 8);
      }
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_range_insert<unsigned_int_const*>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&extra_words,
                 extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                 .super__Vector_impl_data._M_finish,
                 *(undefined8 *)
                  _Var22._M_t.
                  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  .
                  super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                  ._M_head_impl,puVar21);
      *extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start = (uint)has_spec_id;
    }
    else {
      if (*extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start != 2) {
        __assert_fail("extra_words[0] == Array::LengthInfo::kDefiningId",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/type_manager.cpp"
                      ,0x35c,
                      "Type *spvtools::opt::analysis::TypeManager::RecordIfTypeDefinition(const Instruction &)"
                     );
      }
      if (extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&extra_words,
                   (iterator)
                   extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(uint *)&unique);
      }
      else {
        *extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish =
             (uint32_t)
             unique._M_t.
             super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl;
        extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
    }
    if ((ulong)((long)extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start) < 5) {
      __assert_fail("extra_words.size() >= 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/type_manager.cpp"
                    ,0x35f,
                    "Type *spvtools::opt::analysis::TypeManager::RecordIfTypeDefinition(const Instruction &)"
                   );
    }
    decorations.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(decorations.
                           super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,
                           (uint32_t)
                           unique._M_t.
                           super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
                           .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>.
                           _M_head_impl);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &decorations.
                super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                ._M_impl.super__Vector_impl_data._M_finish,&extra_words);
    this_14 = (Array *)operator_new(0x50);
    uVar12 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar12 = (uint)inst->has_result_id_;
    }
    uVar12 = Instruction::GetSingleWordOperand(inst,uVar12);
    pTVar14 = GetType(this,uVar12);
    Array::Array(this_14,pTVar14,(LengthInfo *)&decorations);
    pTVar14 = (Type *)&this->id_to_incomplete_type_;
    uVar12 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar12 = (uint)inst->has_result_id_;
    }
    type = (Type *)this_14;
    local_8c = Instruction::GetSingleWordOperand(inst,uVar12);
    sVar15 = std::
             _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::count((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)pTVar14,&local_8c);
    if (sVar15 != 0) {
      uVar12 = 0;
      if (inst->has_result_id_ == true) {
        uVar12 = Instruction::GetSingleWordOperand(inst,(uint)inst->has_type_id_);
      }
      local_8c = uVar12;
      std::
      vector<spvtools::opt::analysis::TypeManager::UnresolvedType,std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>>
      ::emplace_back<unsigned_int,spvtools::opt::analysis::Type*&>
                ((vector<spvtools::opt::analysis::TypeManager::UnresolvedType,std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>>
                  *)&this->incomplete_types_,&local_8c,&type);
      pTVar16 = type;
      uVar12 = 0;
      if (inst->has_result_id_ == true) {
        uVar12 = Instruction::GetSingleWordOperand(inst,(uint)inst->has_type_id_);
      }
      local_8c = uVar12;
      ppTVar17 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)pTVar14,&local_8c);
      *ppTVar17 = pTVar16;
      pTVar14 = type;
    }
    if (decorations.
        super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
        ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
      operator_delete(decorations.
                      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
                      (long)local_b0 -
                      (long)decorations.
                            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish);
    }
    if (extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)extra_words.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)extra_words.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    goto LAB_0054b07d;
  case OpTypeRuntimeArray:
    this_01 = (NodePayloadArrayAMDX *)operator_new(0x30);
    uVar12 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar12 = (uint)inst->has_result_id_;
    }
    uVar12 = Instruction::GetSingleWordOperand(inst,uVar12);
    pTVar14 = GetType(this,uVar12);
    RuntimeArray::RuntimeArray((RuntimeArray *)this_01,pTVar14);
LAB_0054aba7:
    uVar12 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar12 = (uint)inst->has_result_id_;
    }
    type = &this_01->super_Type;
    uVar12 = Instruction::GetSingleWordOperand(inst,uVar12);
    decorations.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(decorations.
                           super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,uVar12);
    sVar15 = std::
             _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::count(&(this->id_to_incomplete_type_)._M_h,(key_type *)&decorations);
    if (sVar15 != 0) {
      uVar10 = 0;
      uVar12 = 0;
      if (inst->has_result_id_ == true) {
        uVar12 = Instruction::GetSingleWordOperand(inst,(uint)inst->has_type_id_);
      }
      decorations.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(decorations.
                             super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,uVar12);
      std::
      vector<spvtools::opt::analysis::TypeManager::UnresolvedType,std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>>
      ::emplace_back<unsigned_int,spvtools::opt::analysis::Type*&>
                ((vector<spvtools::opt::analysis::TypeManager::UnresolvedType,std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>>
                  *)&this->incomplete_types_,(uint *)&decorations,&type);
      pTVar14 = type;
      if (inst->has_result_id_ == true) {
        uVar10 = Instruction::GetSingleWordOperand(inst,(uint)inst->has_type_id_);
      }
      decorations.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(decorations.
                             super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,uVar10);
      ppTVar17 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&this->id_to_incomplete_type_,(key_type *)&decorations);
      *ppTVar17 = pTVar14;
      return type;
    }
    break;
  case OpTypeStruct:
    decorations.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    decorations.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    decorations.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar24 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar24 = (uint)inst->has_result_id_;
    }
    uVar25 = 0;
    if (uVar24 != (int)((ulong)((long)(inst->operands_).
                                      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(inst->operands_).
                                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555)
    {
      unaff_R12 = (Type *)0x1;
      uVar23 = uVar25;
      uVar25 = 0;
      do {
        uVar12 = Instruction::GetSingleWordOperand(inst,uVar24 + uVar23);
        unique._M_t.
        super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
        .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl._0_4_ = uVar12;
        extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)GetType(this,uVar12);
        std::
        vector<spvtools::opt::analysis::Type_const*,std::allocator<spvtools::opt::analysis::Type_const*>>
        ::emplace_back<spvtools::opt::analysis::Type_const*>
                  ((vector<spvtools::opt::analysis::Type_const*,std::allocator<spvtools::opt::analysis::Type_const*>>
                    *)&decorations,(Type **)&extra_words);
        sVar15 = std::
                 _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::count(&(this->id_to_incomplete_type_)._M_h,(key_type *)&unique);
        if (sVar15 != 0) {
          uVar25 = 1;
        }
        uVar23 = uVar23 + 1;
        uVar24 = (inst->has_result_id_ & 1) + 1;
        if (inst->has_type_id_ == false) {
          uVar24 = (uint)inst->has_result_id_;
        }
      } while (uVar23 < (int)((ulong)((long)(inst->operands_).
                                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(inst->operands_).
                                           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                        -0x55555555 - uVar24);
    }
    this_04 = (Struct *)operator_new(0x70);
    Struct::Struct(this_04,(vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                            *)&decorations);
    type = (Type *)this_04;
    if (uVar25 != 0) {
      uVar10 = 0;
      uVar12 = 0;
      if (inst->has_result_id_ == true) {
        uVar12 = Instruction::GetSingleWordOperand(inst,(uint)inst->has_type_id_);
      }
      extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(extra_words.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start._4_4_,uVar12);
      std::
      vector<spvtools::opt::analysis::TypeManager::UnresolvedType,std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>>
      ::emplace_back<unsigned_int,spvtools::opt::analysis::Type*&>
                ((vector<spvtools::opt::analysis::TypeManager::UnresolvedType,std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>>
                  *)&this->incomplete_types_,(uint *)&extra_words,&type);
      pTVar14 = type;
      if (inst->has_result_id_ == true) {
        uVar10 = Instruction::GetSingleWordOperand(inst,(uint)inst->has_type_id_);
      }
      extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(extra_words.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start._4_4_,uVar10);
      ppTVar17 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&this->id_to_incomplete_type_,(key_type *)&extra_words);
      *ppTVar17 = pTVar14;
      unaff_R12 = type;
    }
    if (decorations.
        super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(decorations.
                      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)decorations.
                            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)decorations.
                            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (uVar25 != 0) {
      return unaff_R12;
    }
    break;
  case OpTypeOpaque:
    pTVar14 = (Type *)operator_new(0x48);
    this_06 = Instruction::GetInOperand(inst,0);
    Operand::AsString_abi_cxx11_(&local_78,this_06);
    (pTVar14->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pTVar14->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pTVar14->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pTVar14->kind_ = kOpaque;
    pTVar14->_vptr_Type = (_func_int **)&PTR__Opaque_0094db48;
    ppvVar1 = &pTVar14[1].decorations_.
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    pTVar14[1]._vptr_Type = (_func_int **)ppvVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p == &local_78.field_2) {
      *ppvVar1 = (pointer)CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                                   local_78.field_2._M_local_buf[0]);
      pTVar14[1].decorations_.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_78.field_2._8_8_;
    }
    else {
      pTVar14[1]._vptr_Type = (_func_int **)local_78._M_dataplus._M_p;
      pTVar14[1].decorations_.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]);
    }
    pTVar14[1].decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_78._M_string_length;
    local_78._M_string_length = 0;
    local_78.field_2._M_local_buf[0] = '\0';
    type = pTVar14;
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    break;
  case OpTypePointer:
    uVar24 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar24 = (uint)inst->has_result_id_;
    }
    uVar12 = Instruction::GetSingleWordOperand(inst,uVar24 + 1);
    decorations.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(decorations.
                           super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,uVar12);
    this_12 = (Pointer *)operator_new(0x38);
    pTVar14 = GetType(this,uVar12);
    uVar12 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar12 = (uint)inst->has_result_id_;
    }
    sc = Instruction::GetSingleWordOperand(inst,uVar12);
    Pointer::Pointer(this_12,pTVar14,sc);
    pTVar14 = (Type *)&this->id_to_incomplete_type_;
    type = (Type *)this_12;
    sVar15 = std::
             _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::count((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)pTVar14,(key_type *)&decorations);
    if (sVar15 == 0) {
      uVar12 = 0;
      if (inst->has_result_id_ == true) {
        uVar12 = Instruction::GetSingleWordOperand(inst,(uint)inst->has_type_id_);
      }
      extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(extra_words.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start._4_4_,uVar12);
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_M_erase((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)pTVar14);
    }
    else {
      uVar12 = 0;
      if (inst->has_result_id_ == true) {
        uVar12 = Instruction::GetSingleWordOperand(inst,(uint)inst->has_type_id_);
      }
      extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(extra_words.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start._4_4_,uVar12);
      std::
      vector<spvtools::opt::analysis::TypeManager::UnresolvedType,std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>>
      ::emplace_back<unsigned_int,spvtools::opt::analysis::Type*&>
                ((vector<spvtools::opt::analysis::TypeManager::UnresolvedType,std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>>
                  *)&this->incomplete_types_,(uint *)&extra_words,&type);
      pTVar16 = type;
      uVar12 = 0;
      if (inst->has_result_id_ == true) {
        uVar12 = Instruction::GetSingleWordOperand(inst,(uint)inst->has_type_id_);
      }
      extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(extra_words.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start._4_4_,uVar12);
      ppTVar17 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)pTVar14,(key_type *)&extra_words);
      *ppTVar17 = pTVar16;
      pTVar14 = type;
    }
LAB_0054b07d:
    if (sVar15 != 0) {
      return pTVar14;
    }
    break;
  case OpTypeFunction:
    uVar12 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar12 = (uint)inst->has_result_id_;
    }
    uVar12 = Instruction::GetSingleWordOperand(inst,uVar12);
    unique._M_t.
    super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
    .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl._0_4_ = uVar12;
    this_00 = &this->id_to_incomplete_type_;
    sVar15 = std::
             _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::count(&this_00->_M_h,(key_type *)&unique);
    bVar27 = sVar15 != 0;
    pTVar14 = GetType(this,(uint32_t)
                           unique._M_t.
                           super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
                           .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>.
                           _M_head_impl);
    decorations.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    decorations.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    decorations.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar24 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar24 = (uint)inst->has_result_id_;
    }
    if (1 < (int)((ulong)((long)(inst->operands_).
                                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(inst->operands_).
                               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 -
            uVar24) {
      bVar27 = sVar15 != 0;
      uVar25 = 1;
      do {
        id = Instruction::GetSingleWordOperand(inst,uVar24 + uVar25);
        extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)GetType(this,id);
        std::
        vector<spvtools::opt::analysis::Type_const*,std::allocator<spvtools::opt::analysis::Type_const*>>
        ::emplace_back<spvtools::opt::analysis::Type_const*>
                  ((vector<spvtools::opt::analysis::Type_const*,std::allocator<spvtools::opt::analysis::Type_const*>>
                    *)&decorations,(Type **)&extra_words);
        sVar15 = std::
                 _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::count(&this_00->_M_h,&id);
        if (sVar15 != 0) {
          bVar27 = true;
        }
        uVar25 = uVar25 + 1;
        uVar24 = (inst->has_result_id_ & 1) + 1;
        if (inst->has_type_id_ == false) {
          uVar24 = (uint)inst->has_result_id_;
        }
      } while (uVar25 < (int)((ulong)((long)(inst->operands_).
                                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(inst->operands_).
                                           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                        -0x55555555 - uVar24);
    }
    this_03 = (Function *)operator_new(0x48);
    analysis::Function::Function
              (this_03,pTVar14,
               (vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                *)&decorations);
    type = (Type *)this_03;
    if (bVar27) {
      uVar10 = 0;
      uVar12 = 0;
      if (inst->has_result_id_ == true) {
        uVar12 = Instruction::GetSingleWordOperand(inst,(uint)inst->has_type_id_);
      }
      extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(extra_words.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start._4_4_,uVar12);
      std::
      vector<spvtools::opt::analysis::TypeManager::UnresolvedType,std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>>
      ::emplace_back<unsigned_int,spvtools::opt::analysis::Type*&>
                ((vector<spvtools::opt::analysis::TypeManager::UnresolvedType,std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>>
                  *)&this->incomplete_types_,(uint *)&extra_words,&type);
      pTVar14 = type;
      if (inst->has_result_id_ == true) {
        uVar10 = Instruction::GetSingleWordOperand(inst,(uint)inst->has_type_id_);
      }
      extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(extra_words.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start._4_4_,uVar10);
      ppTVar17 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)this_00,(key_type *)&extra_words);
      *ppTVar17 = pTVar14;
    }
    pTVar14 = type;
    if (decorations.
        super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(decorations.
                      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)decorations.
                            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)decorations.
                            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (bVar27) {
      return pTVar14;
    }
    break;
  case OpTypeEvent:
    type = (Type *)operator_new(0x28);
    (type->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (type->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (type->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    type->kind_ = kEvent;
    ppuVar19 = &PTR__Type_00949ec8;
    goto LAB_0054ab5d;
  case OpTypeDeviceEvent:
    type = (Type *)operator_new(0x28);
    (type->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (type->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (type->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    type->kind_ = kDeviceEvent;
    ppuVar19 = &PTR__Type_0094a128;
    goto LAB_0054ab5d;
  case OpTypeReserveId:
    type = (Type *)operator_new(0x28);
    (type->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (type->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (type->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    type->kind_ = kReserveId;
    ppuVar19 = &PTR__Type_0094a388;
    goto LAB_0054ab5d;
  case OpTypeQueue:
    type = (Type *)operator_new(0x28);
    (type->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (type->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (type->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    type->kind_ = kQueue;
    ppuVar19 = &PTR__Type_0094a5e8;
LAB_0054ab5d:
    type->_vptr_Type = (_func_int **)ppuVar19;
    break;
  case OpTypePipe:
    pTVar14 = (Type *)operator_new(0x28);
    uVar12 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar12 = (uint)inst->has_result_id_;
    }
    uVar12 = Instruction::GetSingleWordOperand(inst,uVar12);
    (pTVar14->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pTVar14->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pTVar14->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pTVar14->kind_ = kPipe;
    puVar20 = &Pipe::vtable;
LAB_0054acfc:
    pTVar14->_vptr_Type = (_func_int **)(puVar20 + 0x10);
    *(uint32_t *)&pTVar14->field_0x24 = uVar12;
    type = pTVar14;
    break;
  case OpTypeForwardPointer:
    uVar12 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar12 = (uint)inst->has_result_id_;
    }
    uVar12 = Instruction::GetSingleWordOperand(inst,uVar12);
    decorations.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(decorations.
                           super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,uVar12);
    pTVar14 = (Type *)operator_new(0x38);
    uVar24 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar24 = (uint)inst->has_result_id_;
    }
    uVar10 = Instruction::GetSingleWordOperand(inst,uVar24 + 1);
    (pTVar14->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pTVar14->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pTVar14->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pTVar14->kind_ = kForwardPointer;
    pTVar14->_vptr_Type = (_func_int **)&PTR__Type_0094e008;
    *(uint32_t *)&pTVar14->field_0x24 = uVar12;
    *(uint32_t *)&pTVar14[1]._vptr_Type = uVar10;
    pTVar14[1].decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    type = pTVar14;
    std::
    vector<spvtools::opt::analysis::TypeManager::UnresolvedType,std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>>
    ::emplace_back<unsigned_int&,spvtools::opt::analysis::Type*&>
              ((vector<spvtools::opt::analysis::TypeManager::UnresolvedType,std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>>
                *)&this->incomplete_types_,(uint *)&decorations,&type);
    pTVar14 = type;
    ppTVar17 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->id_to_incomplete_type_,(key_type *)&decorations);
    *ppTVar17 = pTVar14;
    return type;
  default:
switchD_00549b55_default:
    __assert_fail("false && \"Type not handled by the type manager.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/type_manager.cpp"
                  ,0x3fc,
                  "Type *spvtools::opt::analysis::TypeManager::RecordIfTypeDefinition(const Instruction &)"
                 );
  }
LAB_0054ad3b:
  uVar12 = 0;
  if (inst->has_result_id_ == true) {
    uVar12 = Instruction::GetSingleWordOperand(inst,(uint)inst->has_type_id_);
  }
  id = uVar12;
  if (uVar12 == 0) {
    consumer = this->consumer_;
    decorations.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x401;
    message = "assertion failed: instruction without result id found";
  }
  else {
    if (type != (Type *)0x0) {
      pIVar4 = this->context_;
      if ((pIVar4->valid_analyses_ & kAnalysisDecorations) == kAnalysisNone) {
        IRContext::BuildDecorationManager(pIVar4);
      }
      this_15 = (TypeManager *)&decorations;
      DecorationManager::GetDecorationsFor
                ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                  *)this_15,
                 (pIVar4->decoration_mgr_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
                 .super__Head_base<0UL,_spvtools::opt::analysis::DecorationManager_*,_false>.
                 _M_head_impl,id,true);
      ppIVar8 = decorations.
                super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (ppIVar26 = decorations.
                      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; ppIVar26 != ppIVar8;
          ppIVar26 = ppIVar26 + 1) {
        AttachDecoration(this_15,*ppIVar26,type);
      }
      unique._M_t.
      super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
      .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl =
           (__uniq_ptr_data<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>,_true,_true>
            )(__uniq_ptr_data<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>,_true,_true>
              )type;
      extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&this->type_pool_;
      pVar28 = std::
               _Hashtable<std::unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>,std::unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>,std::allocator<std::unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>>,std::__detail::_Identity,spvtools::opt::analysis::CompareTypeUniquePointers,spvtools::opt::analysis::HashTypeUniquePointer,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
               ::
               _M_insert<std::unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>,true>>>>
                         ((_Hashtable<std::unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>,std::unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>,std::allocator<std::unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>>,std::__detail::_Identity,spvtools::opt::analysis::CompareTypeUniquePointers,spvtools::opt::analysis::HashTypeUniquePointer,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                           *)extra_words.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start,&unique,&extra_words);
      pTVar5 = *(mapped_type *)
                ((long)pVar28.first.
                       super__Node_iterator_base<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true>
                       ._M_cur.
                       super__Node_iterator_base<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true>
                + 8);
      ppTVar17 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&this->id_to_type_,&id);
      uVar12 = id;
      *ppTVar17 = pTVar5;
      extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           *(pointer *)
            ((long)pVar28.first.
                   super__Node_iterator_base<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true>
                   ._M_cur.
                   super__Node_iterator_base<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true>
            + 8);
      pmVar18 = std::__detail::
                _Map_base<const_spvtools::opt::analysis::Type_*,_std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_std::allocator<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>_>,_std::__detail::_Select1st,_spvtools::opt::analysis::CompareTypePointers,_spvtools::opt::analysis::HashTypePointer,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<const_spvtools::opt::analysis::Type_*,_std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_std::allocator<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>_>,_std::__detail::_Select1st,_spvtools::opt::analysis::CompareTypePointers,_spvtools::opt::analysis::HashTypePointer,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&this->type_to_id_,(key_type *)&extra_words);
      pTVar14 = type;
      *pmVar18 = uVar12;
      if ((__uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
           )unique._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
           )0x0) {
        (**(code **)(*(long *)unique._M_t.
                              super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
                              .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>.
                              _M_head_impl + 8))();
      }
      if (decorations.
          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(decorations.
                        super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)decorations.
                              super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)decorations.
                              super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      return pTVar14;
    }
    consumer = this->consumer_;
    decorations.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x403;
    message = "assertion failed: type should not be nullptr at this point";
  }
  decorations.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  decorations.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  Log(consumer,SPV_MSG_INTERNAL_ERROR,
      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/type_manager.cpp"
      ,(spv_position_t *)&decorations,message);
  exit(1);
}

Assistant:

Type* TypeManager::RecordIfTypeDefinition(const Instruction& inst) {
  if (!IsTypeInst(inst.opcode())) return nullptr;

  Type* type = nullptr;
  switch (inst.opcode()) {
    case spv::Op::OpTypeVoid:
      type = new Void();
      break;
    case spv::Op::OpTypeBool:
      type = new Bool();
      break;
    case spv::Op::OpTypeInt:
      type = new Integer(inst.GetSingleWordInOperand(0),
                         inst.GetSingleWordInOperand(1));
      break;
    case spv::Op::OpTypeFloat:
      type = new Float(inst.GetSingleWordInOperand(0));
      break;
    case spv::Op::OpTypeVector:
      type = new Vector(GetType(inst.GetSingleWordInOperand(0)),
                        inst.GetSingleWordInOperand(1));
      break;
    case spv::Op::OpTypeMatrix:
      type = new Matrix(GetType(inst.GetSingleWordInOperand(0)),
                        inst.GetSingleWordInOperand(1));
      break;
    case spv::Op::OpTypeImage: {
      const spv::AccessQualifier access =
          inst.NumInOperands() < 8 ? spv::AccessQualifier::ReadOnly
                                   : static_cast<spv::AccessQualifier>(
                                         inst.GetSingleWordInOperand(7));
      type = new Image(
          GetType(inst.GetSingleWordInOperand(0)),
          static_cast<spv::Dim>(inst.GetSingleWordInOperand(1)),
          inst.GetSingleWordInOperand(2), inst.GetSingleWordInOperand(3) == 1,
          inst.GetSingleWordInOperand(4) == 1, inst.GetSingleWordInOperand(5),
          static_cast<spv::ImageFormat>(inst.GetSingleWordInOperand(6)),
          access);
    } break;
    case spv::Op::OpTypeSampler:
      type = new Sampler();
      break;
    case spv::Op::OpTypeSampledImage:
      type = new SampledImage(GetType(inst.GetSingleWordInOperand(0)));
      break;
    case spv::Op::OpTypeArray: {
      const uint32_t length_id = inst.GetSingleWordInOperand(1);
      const Instruction* length_constant_inst = id_to_constant_inst_[length_id];
      assert(length_constant_inst);

      // How will we distinguish one length value from another?
      // Determine extra words required to distinguish this array length
      // from another.
      std::vector<uint32_t> extra_words{Array::LengthInfo::kDefiningId};
      // If it is a specialised constant, retrieve its SpecId.
      // Only OpSpecConstant has a SpecId.
      uint32_t spec_id = 0u;
      bool has_spec_id = false;
      if (length_constant_inst->opcode() == spv::Op::OpSpecConstant) {
        context()->get_decoration_mgr()->ForEachDecoration(
            length_id, uint32_t(spv::Decoration::SpecId),
            [&spec_id, &has_spec_id](const Instruction& decoration) {
              assert(decoration.opcode() == spv::Op::OpDecorate);
              spec_id = decoration.GetSingleWordOperand(2u);
              has_spec_id = true;
            });
      }
      const auto opcode = length_constant_inst->opcode();
      if (has_spec_id) {
        extra_words.push_back(spec_id);
      }
      if ((opcode == spv::Op::OpConstant) ||
          (opcode == spv::Op::OpSpecConstant)) {
        // Always include the literal constant words.  In the spec constant
        // case, the constant might not be overridden, so it's still
        // significant.
        extra_words.insert(extra_words.end(),
                           length_constant_inst->GetOperand(2).words.begin(),
                           length_constant_inst->GetOperand(2).words.end());
        extra_words[0] = has_spec_id ? Array::LengthInfo::kConstantWithSpecId
                                     : Array::LengthInfo::kConstant;
      } else {
        assert(extra_words[0] == Array::LengthInfo::kDefiningId);
        extra_words.push_back(length_id);
      }
      assert(extra_words.size() >= 2);
      Array::LengthInfo length_info{length_id, extra_words};

      type = new Array(GetType(inst.GetSingleWordInOperand(0)), length_info);

      if (id_to_incomplete_type_.count(inst.GetSingleWordInOperand(0))) {
        incomplete_types_.emplace_back(inst.result_id(), type);
        id_to_incomplete_type_[inst.result_id()] = type;
        return type;
      }
    } break;
    case spv::Op::OpTypeRuntimeArray:
      type = new RuntimeArray(GetType(inst.GetSingleWordInOperand(0)));
      if (id_to_incomplete_type_.count(inst.GetSingleWordInOperand(0))) {
        incomplete_types_.emplace_back(inst.result_id(), type);
        id_to_incomplete_type_[inst.result_id()] = type;
        return type;
      }
      break;
    case spv::Op::OpTypeNodePayloadArrayAMDX:
      type = new NodePayloadArrayAMDX(GetType(inst.GetSingleWordInOperand(0)));
      if (id_to_incomplete_type_.count(inst.GetSingleWordInOperand(0))) {
        incomplete_types_.emplace_back(inst.result_id(), type);
        id_to_incomplete_type_[inst.result_id()] = type;
        return type;
      }
      break;
    case spv::Op::OpTypeStruct: {
      std::vector<const Type*> element_types;
      bool incomplete_type = false;
      for (uint32_t i = 0; i < inst.NumInOperands(); ++i) {
        uint32_t type_id = inst.GetSingleWordInOperand(i);
        element_types.push_back(GetType(type_id));
        if (id_to_incomplete_type_.count(type_id)) {
          incomplete_type = true;
        }
      }
      type = new Struct(element_types);

      if (incomplete_type) {
        incomplete_types_.emplace_back(inst.result_id(), type);
        id_to_incomplete_type_[inst.result_id()] = type;
        return type;
      }
    } break;
    case spv::Op::OpTypeOpaque: {
      type = new Opaque(inst.GetInOperand(0).AsString());
    } break;
    case spv::Op::OpTypePointer: {
      uint32_t pointee_type_id = inst.GetSingleWordInOperand(1);
      type = new Pointer(
          GetType(pointee_type_id),
          static_cast<spv::StorageClass>(inst.GetSingleWordInOperand(0)));

      if (id_to_incomplete_type_.count(pointee_type_id)) {
        incomplete_types_.emplace_back(inst.result_id(), type);
        id_to_incomplete_type_[inst.result_id()] = type;
        return type;
      }
      id_to_incomplete_type_.erase(inst.result_id());

    } break;
    case spv::Op::OpTypeFunction: {
      bool incomplete_type = false;
      uint32_t return_type_id = inst.GetSingleWordInOperand(0);
      if (id_to_incomplete_type_.count(return_type_id)) {
        incomplete_type = true;
      }
      Type* return_type = GetType(return_type_id);
      std::vector<const Type*> param_types;
      for (uint32_t i = 1; i < inst.NumInOperands(); ++i) {
        uint32_t param_type_id = inst.GetSingleWordInOperand(i);
        param_types.push_back(GetType(param_type_id));
        if (id_to_incomplete_type_.count(param_type_id)) {
          incomplete_type = true;
        }
      }

      type = new Function(return_type, param_types);

      if (incomplete_type) {
        incomplete_types_.emplace_back(inst.result_id(), type);
        id_to_incomplete_type_[inst.result_id()] = type;
        return type;
      }
    } break;
    case spv::Op::OpTypeEvent:
      type = new Event();
      break;
    case spv::Op::OpTypeDeviceEvent:
      type = new DeviceEvent();
      break;
    case spv::Op::OpTypeReserveId:
      type = new ReserveId();
      break;
    case spv::Op::OpTypeQueue:
      type = new Queue();
      break;
    case spv::Op::OpTypePipe:
      type = new Pipe(
          static_cast<spv::AccessQualifier>(inst.GetSingleWordInOperand(0)));
      break;
    case spv::Op::OpTypeForwardPointer: {
      // Handling of forward pointers is different from the other types.
      uint32_t target_id = inst.GetSingleWordInOperand(0);
      type = new ForwardPointer(target_id, static_cast<spv::StorageClass>(
                                               inst.GetSingleWordInOperand(1)));
      incomplete_types_.emplace_back(target_id, type);
      id_to_incomplete_type_[target_id] = type;
      return type;
    }
    case spv::Op::OpTypePipeStorage:
      type = new PipeStorage();
      break;
    case spv::Op::OpTypeNamedBarrier:
      type = new NamedBarrier();
      break;
    case spv::Op::OpTypeAccelerationStructureNV:
      type = new AccelerationStructureNV();
      break;
    case spv::Op::OpTypeCooperativeMatrixNV:
      type = new CooperativeMatrixNV(GetType(inst.GetSingleWordInOperand(0)),
                                     inst.GetSingleWordInOperand(1),
                                     inst.GetSingleWordInOperand(2),
                                     inst.GetSingleWordInOperand(3));
      break;
    case spv::Op::OpTypeCooperativeMatrixKHR:
      type = new CooperativeMatrixKHR(
          GetType(inst.GetSingleWordInOperand(0)),
          inst.GetSingleWordInOperand(1), inst.GetSingleWordInOperand(2),
          inst.GetSingleWordInOperand(3), inst.GetSingleWordInOperand(4));
      break;
    case spv::Op::OpTypeCooperativeVectorNV:
      type = new CooperativeVectorNV(GetType(inst.GetSingleWordInOperand(0)),
                                     inst.GetSingleWordInOperand(1));
      break;
    case spv::Op::OpTypeRayQueryKHR:
      type = new RayQueryKHR();
      break;
    case spv::Op::OpTypeHitObjectNV:
      type = new HitObjectNV();
      break;
    case spv::Op::OpTypeTensorLayoutNV:
      type = new TensorLayoutNV(inst.GetSingleWordInOperand(0),
                                inst.GetSingleWordInOperand(1));
      break;
    case spv::Op::OpTypeTensorViewNV: {
      const auto count = inst.NumOperands();
      std::vector<uint32_t> perm;
      for (uint32_t i = 2; i < count; ++i) {
        perm.push_back(inst.GetSingleWordOperand(i));
      }
      type = new TensorViewNV(inst.GetSingleWordInOperand(0),
                              inst.GetSingleWordInOperand(1), perm);
      break;
    }
    default:
      assert(false && "Type not handled by the type manager.");
      break;
  }

  uint32_t id = inst.result_id();
  SPIRV_ASSERT(consumer_, id != 0, "instruction without result id found");
  SPIRV_ASSERT(consumer_, type != nullptr,
               "type should not be nullptr at this point");
  std::vector<Instruction*> decorations =
      context()->get_decoration_mgr()->GetDecorationsFor(id, true);
  for (auto dec : decorations) {
    AttachDecoration(*dec, type);
  }
  std::unique_ptr<Type> unique(type);
  auto pair = type_pool_.insert(std::move(unique));
  id_to_type_[id] = pair.first->get();
  type_to_id_[pair.first->get()] = id;
  return type;
}